

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O2

DoubleToStringConverter * FIX::double_conversion::DoubleToStringConverter::EcmaScriptConverter(void)

{
  int iVar1;
  
  if ((EcmaScriptConverter()::converter == '\0') &&
     (iVar1 = __cxa_guard_acquire(&EcmaScriptConverter()::converter), iVar1 != 0)) {
    EcmaScriptConverter::converter.flags_ = 9;
    EcmaScriptConverter::converter.infinity_symbol_ = "Infinity";
    EcmaScriptConverter::converter.nan_symbol_ = "NaN";
    EcmaScriptConverter::converter.exponent_character_ = 'e';
    EcmaScriptConverter::converter.decimal_in_shortest_low_ = -6;
    EcmaScriptConverter::converter.decimal_in_shortest_high_ = 0x15;
    EcmaScriptConverter::converter.max_leading_padding_zeroes_in_precision_mode_ = 6;
    EcmaScriptConverter::converter.max_trailing_padding_zeroes_in_precision_mode_ = 0;
    __cxa_guard_release(&EcmaScriptConverter()::converter);
  }
  return &EcmaScriptConverter::converter;
}

Assistant:

const DoubleToStringConverter& DoubleToStringConverter::EcmaScriptConverter() {
  int flags = UNIQUE_ZERO | EMIT_POSITIVE_EXPONENT_SIGN;
  static DoubleToStringConverter converter(flags,
                                           "Infinity",
                                           "NaN",
                                           'e',
                                           -6, 21,
                                           6, 0);
  return converter;
}